

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object_history.cpp
# Opt level: O3

bool __thiscall
ON_HistoryRecord::SetGeometryValue(ON_HistoryRecord *this,int value_id,ON_Geometry *g)

{
  bool bVar1;
  ON_SimpleArray<ON_Geometry_*> a;
  ON_SimpleArray<ON_Geometry_*> local_60;
  ON_SimpleArray<ON_Geometry_*> local_48;
  ON_Geometry *local_30;
  
  local_48._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00816db8;
  local_48.m_a = (ON_Geometry **)0x0;
  local_48.m_count = 0;
  local_48.m_capacity = 0;
  local_30 = g;
  ON_SimpleArray<ON_Geometry_*>::SetCapacity(&local_48,1);
  ON_SimpleArray<ON_Geometry_*>::Append(&local_48,&local_30);
  local_60._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00816db8;
  local_60.m_a = (ON_Geometry **)0x0;
  local_60.m_count = 0;
  local_60.m_capacity = 0;
  ON_SimpleArray<ON_Geometry_*>::operator=(&local_60,&local_48);
  bVar1 = SetGeometryValues(this,value_id,&local_60);
  ON_SimpleArray<ON_Geometry_*>::~ON_SimpleArray(&local_60);
  ON_SimpleArray<ON_Geometry_*>::~ON_SimpleArray(&local_48);
  return bVar1;
}

Assistant:

bool ON_HistoryRecord::SetGeometryValue( int value_id, ON_Geometry* g)
{
  ON_SimpleArray<ON_Geometry*> a(1);
  a.Append(g);
  return SetGeometryValues(value_id, a);
}